

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_NCName_ID_IDREF_ENTITY(DataType dt)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_4d0;
  StrX local_4c0;
  StrX local_4b0;
  long local_4a0;
  XMLCh *actRetCanRep_5;
  undefined1 local_490 [4];
  Status myStatus_17;
  StrX local_480;
  StrX local_470;
  long local_460;
  XMLCh *actRetCanRep_4;
  undefined1 local_450 [4];
  Status myStatus_16;
  StrX local_440;
  StrX local_430;
  long local_420;
  XMLCh *actRetCanRep_3;
  undefined1 local_410 [4];
  Status myStatus_15;
  StrX local_400;
  StrX local_3f0;
  long local_3e0;
  XMLCh *actRetCanRep_2;
  undefined1 local_3d0 [4];
  Status myStatus_14;
  StrX local_3c0;
  StrX local_3b0;
  long local_3a0;
  XMLCh *actRetCanRep_1;
  undefined1 local_390 [4];
  Status myStatus_13;
  StrX local_380;
  StrX local_370;
  long local_360;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_340;
  StrX local_330;
  XSValue *local_320;
  XSValue *actRetValue_5;
  undefined1 local_310 [4];
  Status myStatus_11;
  StrX local_300;
  StrX local_2f0;
  XSValue *local_2e0;
  XSValue *actRetValue_4;
  undefined1 local_2d0 [4];
  Status myStatus_10;
  StrX local_2c0;
  StrX local_2b0;
  XSValue *local_2a0;
  XSValue *actRetValue_3;
  undefined1 local_290 [4];
  Status myStatus_9;
  StrX local_280;
  StrX local_270;
  XSValue *local_260;
  XSValue *actRetValue_2;
  undefined1 local_250 [4];
  Status myStatus_8;
  StrX local_240;
  StrX local_230;
  XSValue *local_220;
  XSValue *actRetValue_1;
  undefined1 local_210 [4];
  Status myStatus_7;
  StrX local_200;
  StrX local_1f0;
  XSValue *local_1e0;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_1c0;
  byte local_1ad;
  Status local_1ac;
  undefined1 local_1a8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_198;
  byte local_185;
  Status local_184;
  undefined1 local_180 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_170;
  byte local_15d;
  Status local_15c;
  undefined1 local_158 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_148;
  byte local_135;
  Status local_134;
  undefined1 local_130 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_120;
  byte local_10d;
  Status local_10c;
  undefined1 local_108 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_e8;
  byte local_d5;
  Status local_d4;
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [5];
  char iv_2 [13];
  char iv_1 [9];
  char v_3 [5];
  char v_2 [12];
  char v_1 [8];
  bool toValidate;
  DataType dt_local;
  
  stack0xffffffffffffffe8 = 0x2e5f2d72756f46;
  _v_3 = 0x68636f7265655a5f;
  v_2[0] = 'e';
  v_2[1] = 'r';
  v_2[2] = 't';
  v_2[3] = '\0';
  stack0xffffffffffffffd0 = 0x3730304c;
  stack0xffffffffffffffc0 = 0x2e5f2d72756f463a;
  iv_1[0] = '\0';
  iv_2[0] = 'e';
  iv_2[1] = 'r';
  iv_2[2] = 't';
  iv_2[3] = ':';
  iv_2[4] = '\0';
  builtin_strncpy(iv_3,"_Zeer",5);
  act_v_ran_v_1.fValue._28_1_ = 0;
  act_v_ran_v_1.fValue._24_4_ = 0x37303a30;
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  act_v_ran_v_3.f_datatype = dt_string;
  act_v_ran_v_3._4_4_ = 0;
  local_d4 = st_Init;
  StrX::StrX(&local_e8,v_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_e8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt,&local_d4,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_e8);
  local_d5 = bVar1 & 1;
  if (local_d5 != 1) {
    pXVar4 = getDataTypeString(dt);
    StrX::StrX((StrX *)local_108,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_108);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1784,v_2 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_108);
    errSeen = true;
  }
  local_10c = st_Init;
  StrX::StrX(&local_120,v_3);
  pXVar4 = StrX::unicodeForm(&local_120);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt,&local_10c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_120);
  local_10d = bVar1 & 1;
  if (local_10d != 1) {
    pXVar4 = getDataTypeString(dt);
    StrX::StrX((StrX *)local_130,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_130);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1785,v_3,pcVar5,1);
    StrX::~StrX((StrX *)local_130);
    errSeen = true;
  }
  local_134 = st_Init;
  StrX::StrX(&local_148,iv_1 + 8);
  pXVar4 = StrX::unicodeForm(&local_148);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt,&local_134,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_148);
  local_135 = bVar1 & 1;
  if (local_135 != 1) {
    pXVar4 = getDataTypeString(dt);
    StrX::StrX((StrX *)local_158,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_158);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1786,iv_1 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_158);
    errSeen = true;
  }
  local_15c = st_Init;
  StrX::StrX(&local_170,iv_2 + 8);
  pXVar4 = StrX::unicodeForm(&local_170);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt,&local_15c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_170);
  local_15d = bVar1 & 1;
  if (local_15d != 0) {
    pXVar4 = getDataTypeString(dt);
    StrX::StrX((StrX *)local_180,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_180);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1789,iv_2 + 8,pcVar5,0);
    StrX::~StrX((StrX *)local_180);
    errSeen = true;
  }
  local_184 = st_Init;
  StrX::StrX(&local_198,iv_3);
  pXVar4 = StrX::unicodeForm(&local_198);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt,&local_184,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  local_185 = bVar1 & 1;
  if (local_185 != 0) {
    pXVar4 = getDataTypeString(dt);
    StrX::StrX((StrX *)local_1a8,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_1a8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178a,iv_3,pcVar5,0);
    StrX::~StrX((StrX *)local_1a8);
    errSeen = true;
  }
  local_1ac = st_Init;
  StrX::StrX(&local_1c0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_1c0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt,&local_1ac,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1c0);
  local_1ad = bVar1 & 1;
  if (local_1ad != 0) {
    pXVar4 = getDataTypeString(dt);
    StrX::StrX((StrX *)&myStatus_6,pXVar4);
    pcVar5 = StrX::localForm((StrX *)&myStatus_6);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178b,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,0);
    StrX::~StrX((StrX *)&myStatus_6);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = st_Init;
    StrX::StrX(&local_1f0,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_1f0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_1f0);
    local_1e0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)actRetValue != st_NoActVal) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_210,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_210);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString((Status)actRetValue);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a5,v_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_210);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_200,pXVar4);
      StrX::localForm(&local_200);
      pvVar10 = (void *)0x17a5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a5,v_2 + 8);
      StrX::~StrX(&local_200);
      pXVar6 = local_1e0;
      errSeen = true;
      if (local_1e0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_1e0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = st_Init;
    StrX::StrX(&local_230,v_3);
    pXVar4 = StrX::unicodeForm(&local_230);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    local_220 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_1._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_250,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_250);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_1._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a6,v_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_250);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_240,pXVar4);
      StrX::localForm(&local_240);
      pvVar10 = (void *)0x17a6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a6,v_3);
      StrX::~StrX(&local_240);
      pXVar6 = local_220;
      errSeen = true;
      if (local_220 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_220);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_270,iv_1 + 8);
    pXVar4 = StrX::unicodeForm(&local_270);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_270);
    local_260 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_290,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_290);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a7,iv_1 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_290);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_280,pXVar4);
      StrX::localForm(&local_280);
      pvVar10 = (void *)0x17a7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a7,iv_1 + 8);
      StrX::~StrX(&local_280);
      pXVar6 = local_260;
      errSeen = true;
      if (local_260 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_260);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_2b0,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_2b0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2b0);
    local_2a0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_3._4_4_) {
          pXVar4 = getDataTypeString(dt);
          StrX::StrX((StrX *)local_2d0,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2d0);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_3._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x17ab,iv_2 + 8,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2d0);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_2c0,pXVar4);
      StrX::localForm(&local_2c0);
      pvVar10 = (void *)0x17ab;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ab,iv_2 + 8);
      StrX::~StrX(&local_2c0);
      pXVar6 = local_2a0;
      errSeen = true;
      if (local_2a0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2a0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_2f0,iv_3);
    pXVar4 = StrX::unicodeForm(&local_2f0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2f0);
    local_2e0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_4._4_4_) {
          pXVar4 = getDataTypeString(dt);
          StrX::StrX((StrX *)local_310,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_310);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_4._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x17ad,iv_3,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_310);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_300,pXVar4);
      StrX::localForm(&local_300);
      pvVar10 = (void *)0x17ad;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ad,iv_3);
      StrX::~StrX(&local_300);
      pXVar6 = local_2e0;
      errSeen = true;
      if (local_2e0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2e0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_330,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_330);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_330);
    local_320 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_5._4_4_) {
          pXVar4 = getDataTypeString(dt);
          StrX::StrX((StrX *)&myStatus_12,pXVar4);
          pcVar5 = StrX::localForm((StrX *)&myStatus_12);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_5._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x17af,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)&myStatus_12);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_340,pXVar4);
      StrX::localForm(&local_340);
      pvVar10 = (void *)0x17af;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17af,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_340);
      pXVar6 = local_320;
      errSeen = true;
      if (local_320 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_320);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_370,v_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_370);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_370);
    local_360 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_390,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_390);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17cc,v_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_390);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_380,pXVar4);
      StrX::localForm(&local_380);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17cc,v_2 + 8);
      StrX::~StrX(&local_380);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_360);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_3b0,v_3);
    pXVar4 = StrX::unicodeForm(&local_3b0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3b0);
    local_3a0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_3d0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3d0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17cd,v_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3d0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_3c0,pXVar4);
      StrX::localForm(&local_3c0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17cd,v_3);
      StrX::~StrX(&local_3c0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3a0);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_3f0,iv_1 + 8);
    pXVar4 = StrX::unicodeForm(&local_3f0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3f0);
    local_3e0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_410,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_410);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ce,iv_1 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_410);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_400,pXVar4);
      StrX::localForm(&local_400);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ce,iv_1 + 8);
      StrX::~StrX(&local_400);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3e0);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_430,iv_2 + 8);
    pXVar4 = StrX::unicodeForm(&local_430);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_430);
    local_420 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_450,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_450);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d2,iv_2 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_450);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_440,pXVar4);
      StrX::localForm(&local_440);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d2,iv_2 + 8);
      StrX::~StrX(&local_440);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_420);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_470,iv_3);
    pXVar4 = StrX::unicodeForm(&local_470);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    local_460 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX((StrX *)local_490,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_490);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d4,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_490);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_480,pXVar4);
      StrX::localForm(&local_480);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d4,iv_3);
      StrX::~StrX(&local_480);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_460);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_4b0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_4b0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4b0);
    local_4a0 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt);
        StrX::StrX(&local_4d0,pXVar4);
        pcVar5 = StrX::localForm(&local_4d0);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d6,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_4d0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt);
      StrX::StrX(&local_4c0,pXVar4);
      StrX::localForm(&local_4c0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d6,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_4c0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4a0);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_NCName_ID_IDREF_ENTITY(XSValue::DataType dt)
{
    bool  toValidate = true;

    const char v_1[]="Four-_.";
    const char v_2[]="_Zeerochert";
    const char v_3[]="L007";

    const char iv_1[]=":Four-_.";
    const char iv_2[]="_Zeerochert:";
    const char iv_3[]="0:07";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}